

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_update_checksum_start(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_md5_update(&ssl->handshake->fin_md5,buf,len);
  mbedtls_sha1_update(&ssl->handshake->fin_sha1,buf,len);
  mbedtls_sha256_update(&ssl->handshake->fin_sha256,buf,len);
  mbedtls_sha512_update(&ssl->handshake->fin_sha512,buf,len);
  return;
}

Assistant:

static void ssl_update_checksum_start( mbedtls_ssl_context *ssl,
                                       const unsigned char *buf, size_t len )
{
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
     mbedtls_md5_update( &ssl->handshake->fin_md5 , buf, len );
    mbedtls_sha1_update( &ssl->handshake->fin_sha1, buf, len );
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA256_C)
    mbedtls_sha256_update( &ssl->handshake->fin_sha256, buf, len );
#endif
#if defined(MBEDTLS_SHA512_C)
    mbedtls_sha512_update( &ssl->handshake->fin_sha512, buf, len );
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
}